

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlCtxtErrIO(xmlParserCtxtPtr ctxt,int code,char *uri)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *msg;
  xmlErrorLevel level;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return;
  }
  if (code != 0x5dc) {
    if (code == 0x607) {
      level = XML_ERR_ERROR;
      goto LAB_0014208f;
    }
    if (code != 0x5f4) {
      level = XML_ERR_FATAL;
      goto LAB_0014208f;
    }
  }
  level = XML_ERR_ERROR - (ctxt->validate == 0);
LAB_0014208f:
  pcVar2 = xmlErrString(code);
  msg = "failed to load \"%s\": %s\n";
  pcVar3 = pcVar2;
  pcVar1 = uri;
  if (uri == (char *)0x0) {
    msg = "%s\n";
    pcVar3 = (char *)0x0;
    pcVar1 = pcVar2;
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_IO,code,level,(xmlChar *)uri,(xmlChar *)0x0,
             (xmlChar *)0x0,0,msg,pcVar1,pcVar3);
  return;
}

Assistant:

void
xmlCtxtErrIO(xmlParserCtxtPtr ctxt, int code, const char *uri)
{
    const char *errstr, *msg, *str1, *str2;
    xmlErrorLevel level;

    if (ctxt == NULL)
        return;

    if (((code == XML_IO_ENOENT) ||
         (code == XML_IO_UNKNOWN))) {
        /*
         * Only report a warning if a file could not be found. This should
         * only be done for external entities, but the external entity loader
         * of xsltproc can try multiple paths and assumes that ENOENT doesn't
         * raise an error and aborts parsing.
         */
        if (ctxt->validate == 0)
            level = XML_ERR_WARNING;
        else
            level = XML_ERR_ERROR;
    } else if (code == XML_IO_NETWORK_ATTEMPT) {
        level = XML_ERR_ERROR;
    } else {
        level = XML_ERR_FATAL;
    }

    errstr = xmlErrString(code);

    if (uri == NULL) {
        msg = "%s\n";
        str1 = errstr;
        str2 = NULL;
    } else {
        msg = "failed to load \"%s\": %s\n";
        str1 = uri;
        str2 = errstr;
    }

    xmlCtxtErr(ctxt, NULL, XML_FROM_IO, code, level,
               (const xmlChar *) uri, NULL, NULL, 0,
               msg, str1, str2);
}